

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::TypedConfigurations::setValue<bool>
          (TypedConfigurations *this,Level level,bool *value,
          unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
          *confMap,bool includeGlobalLevel)

{
  bool bVar1;
  pair<el::Level,_bool> pVar2;
  pointer ppVar3;
  mapped_type *pmVar4;
  pair<el::Level,_bool> *in_RCX;
  byte *in_RDX;
  byte in_R8B;
  iterator it;
  unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  byte bVar5;
  pair<el::Level,_bool> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined1 uVar6;
  _Node_iterator_base<std::pair<const_el::Level,_bool>,_true> local_68;
  _Node_iterator_base<std::pair<const_el::Level,_bool>,_true> local_60;
  _Node_iterator_base<std::pair<const_el::Level,_bool>,_true> local_58;
  undefined4 local_4c;
  _Node_iterator_base<std::pair<const_el::Level,_bool>,_true> local_48 [3];
  undefined4 local_30;
  Level local_2c;
  undefined1 local_28;
  byte local_21;
  pair<el::Level,_bool> *local_20;
  byte *local_18;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  bVar1 = utils::std::
          unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
          ::empty((unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                   *)0x239fdf);
  if ((bVar1) && ((local_21 & 1) != 0)) {
    local_30 = 1;
    pVar2 = std::make_pair<el::Level,bool_const&>
                      ((Level *)in_stack_ffffffffffffff58,(bool *)0x23a016);
    local_2c = pVar2.first;
    local_28 = pVar2.second;
    std::
    unordered_map<el::Level,bool,std::hash<el::Level>,std::equal_to<el::Level>,std::allocator<std::pair<el::Level_const,bool>>>
    ::insert<std::pair<el::Level,bool>>
              ((unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
  }
  else {
    local_4c = 1;
    local_48[0]._M_cur =
         (__node_type *)
         utils::std::
         unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
         ::find(in_stack_ffffffffffffff58,(key_type *)0x23a05e);
    local_58._M_cur =
         (__node_type *)
         utils::std::
         unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
         ::end(in_stack_ffffffffffffff58);
    bVar1 = utils::std::__detail::operator!=(local_48,&local_58);
    uVar6 = false;
    if (bVar1) {
      ppVar3 = utils::std::__detail::_Node_iterator<std::pair<const_el::Level,_bool>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_el::Level,_bool>,_false,_true> *)0x23a09d)
      ;
      uVar6 = (ppVar3->second & 1U) == (*local_18 & 1);
    }
    if ((bool)uVar6 == false) {
      local_60._M_cur =
           (__node_type *)
           utils::std::
           unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
           ::find(in_stack_ffffffffffffff58,(key_type *)0x23a0e2);
      local_48[0]._M_cur = local_60._M_cur;
      local_68._M_cur =
           (__node_type *)
           utils::std::
           unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
           ::end(in_stack_ffffffffffffff58);
      bVar1 = utils::std::__detail::operator==(local_48,&local_68);
      if (bVar1) {
        std::make_pair<el::Level&,bool_const&>((Level *)in_stack_ffffffffffffff58,(bool *)0x23a13a);
        std::
        unordered_map<el::Level,bool,std::hash<el::Level>,std::equal_to<el::Level>,std::allocator<std::pair<el::Level_const,bool>>>
        ::insert<std::pair<el::Level,bool>>
                  ((unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                    *)CONCAT17(uVar6,in_stack_ffffffffffffff70),local_20);
      }
      else {
        bVar5 = *local_18;
        pmVar4 = utils::std::
                 unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                 ::at((unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                       *)CONCAT17(bVar5,in_stack_ffffffffffffff60),
                      (key_type *)in_stack_ffffffffffffff58);
        *pmVar4 = (mapped_type)(bVar5 & 1);
      }
    }
  }
  return;
}

Assistant:

void setValue(Level level, const Conf_T& value, std::unordered_map<Level, Conf_T>* confMap,
                bool includeGlobalLevel = true) {
    // If map is empty and we are allowed to add into generic level (Level::Global), do it!
    if (confMap->empty() && includeGlobalLevel) {
      confMap->insert(std::make_pair(Level::Global, value));
      return;
    }
    // If same value exist in generic level already, dont add it to explicit level
    typename std::unordered_map<Level, Conf_T>::iterator it = confMap->find(Level::Global);
    if (it != confMap->end() && it->second == value) {
      return;
    }
    // Now make sure we dont double up values if we really need to add it to explicit level
    it = confMap->find(level);
    if (it == confMap->end()) {
      // Value not found for level, add new
      confMap->insert(std::make_pair(level, value));
    } else {
      // Value found, just update value
      confMap->at(level) = value;
    }
  }